

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

void __thiscall EthUdpPort::~EthUdpPort(EthUdpPort *this)

{
  SocketInternals *this_00;
  EthUdpPort *this_local;
  
  (this->super_EthBasePort).super_BasePort._vptr_BasePort = (_func_int **)&PTR_Init_0012ba10;
  (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[1])();
  this_00 = this->sockPtr;
  if (this_00 != (SocketInternals *)0x0) {
    SocketInternals::~SocketInternals(this_00);
    operator_delete(this_00,0x68);
  }
  std::__cxx11::string::~string((string *)&this->MulticastIP);
  std::__cxx11::string::~string((string *)&this->ServerIP);
  EthBasePort::~EthBasePort(&this->super_EthBasePort);
  return;
}

Assistant:

EthUdpPort::~EthUdpPort()
{
    Cleanup();
    delete sockPtr;
}